

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

double __thiscall sophia_interface::ULANGL(sophia_interface *this,double X,double Y)

{
  int iVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  int sgn;
  double R;
  double result;
  double Y_local;
  double X_local;
  sophia_interface *this_local;
  
  iVar1 = (int)this;
  dVar2 = sqrt(X * X + Y * Y);
  if (1e-20 <= dVar2) {
    std::abs(iVar1);
    if (0.8 <= extraout_XMM0_Qa / dVar2) {
      R = asin(Y / dVar2);
      if ((0.0 <= X) || (R < 0.0)) {
        if (X < 0.0) {
          R = -PARU[0] - R;
        }
      }
      else {
        R = PARU[0] - R;
      }
    }
    else {
      iVar1 = 1;
      if (Y < 0.0) {
        iVar1 = -1;
      }
      dVar2 = acos(X / dVar2);
      R = dVar2 * (double)iVar1;
    }
    this_local = (sophia_interface *)R;
  }
  else {
    this_local = (sophia_interface *)0x0;
  }
  return (double)this_local;
}

Assistant:

double sophia_interface::ULANGL(double X, double Y) {
// Purpose: to reconstruct an angle from given x and y coordinates.
    double result = 0.;
    double R = std::sqrt(X * X + Y * Y);
    if (R < 1e-20) return 0.;
    if (std::abs(X) / R < 0.8) {
        int sgn = (Y < 0)? -1 : 1;
        result = std::acos(X / R) * sgn;
    } else {
        result = std::asin(Y / R);
        if (X < 0. && result >= 0.) {
            result = PARU[0] - result;
        } else if (X < 0.) {
            result = -PARU[0] - result;
        }
    }
    return result;
}